

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

void __thiscall
helics::ValueFederateManager::ValueFederateManager
          (ValueFederateManager *this,Core *coreOb,ValueFederate *vfed,LocalFederateId id,
          bool singleThreaded)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  
  this->useJsonSerialization = false;
  (this->fedID).fid = id.fid;
  bVar2 = !singleThreaded;
  (this->inputs).m_obj.dataStorage.csize = 0;
  (this->inputs).m_obj.dataStorage.dataptr = (Input **)0x0;
  (this->inputs).m_obj.dataStorage.dataSlotsAvailable = 0;
  (this->inputs).m_obj.dataStorage.dataSlotIndex = 0;
  (this->inputs).m_obj.dataStorage.bsize = 0x20;
  (this->inputs).m_obj.dataStorage.freeSlotsAvailable = 0;
  (this->inputs).m_obj.dataStorage.freeIndex = 0;
  (this->inputs).m_obj.dataStorage.freeblocks = (Input **)0x0;
  (this->inputs).m_obj.lookup1._M_h._M_buckets = &(this->inputs).m_obj.lookup1._M_h._M_single_bucket
  ;
  (this->inputs).m_obj.lookup1._M_h._M_bucket_count = 1;
  (this->inputs).m_obj.lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs).m_obj.lookup1._M_h._M_element_count = 0;
  (this->inputs).m_obj.lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs).m_obj.lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs).m_obj.lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->inputs).m_obj.names.csize = 0;
  (this->inputs).m_obj.names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->inputs).m_obj.names.dataSlotsAvailable = 0;
  (this->inputs).m_obj.names.dataSlotIndex = 0;
  (this->inputs).m_obj.names.bsize = 0x20;
  (this->inputs).m_obj.names.freeSlotsAvailable = 0;
  (this->inputs).m_obj.names.freeIndex = 0;
  (this->inputs).m_obj.names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  p_Var1 = &(this->inputs).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header;
  (this->inputs).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->inputs).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->inputs).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->inputs).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var1;
  (this->inputs).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->inputs).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->inputs).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->inputs).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->inputs).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputs).m_mutex.super___mutex_base._M_mutex.__align = 0;
  (this->inputs).enabled = bVar2;
  (this->publications).m_obj.dataStorage.csize = 0;
  (this->publications).m_obj.dataStorage.dataptr = (Publication **)0x0;
  (this->publications).m_obj.dataStorage.dataSlotsAvailable = 0;
  (this->publications).m_obj.dataStorage.dataSlotIndex = 0;
  (this->publications).m_obj.dataStorage.bsize = 0x20;
  (this->publications).m_obj.dataStorage.freeSlotsAvailable = 0;
  (this->publications).m_obj.dataStorage.freeIndex = 0;
  (this->publications).m_obj.dataStorage.freeblocks = (Publication **)0x0;
  (this->publications).m_obj.lookup1._M_h._M_buckets =
       &(this->publications).m_obj.lookup1._M_h._M_single_bucket;
  (this->publications).m_obj.lookup1._M_h._M_bucket_count = 1;
  (this->publications).m_obj.lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->publications).m_obj.lookup1._M_h._M_element_count = 0;
  (this->publications).m_obj.lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->publications).m_obj.lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->publications).m_obj.lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->publications).m_obj.names.csize = 0;
  (this->publications).m_obj.names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->publications).m_obj.names.dataSlotsAvailable = 0;
  (this->publications).m_obj.names.dataSlotIndex = 0;
  (this->publications).m_obj.names.bsize = 0x20;
  (this->publications).m_obj.names.freeSlotsAvailable = 0;
  (this->publications).m_obj.names.freeIndex = 0;
  (this->publications).m_obj.names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  p_Var1 = &(this->publications).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header;
  (this->publications).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->publications).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->publications).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->publications).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var1;
  (this->publications).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->publications).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->publications).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->publications).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->publications).m_obj.lookup2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->publications).m_mutex.super___mutex_base._M_mutex.__align = 0;
  (this->publications).enabled = bVar2;
  (this->CurrentTime).internalTimeCode = -1000000000;
  this->coreObject = coreOb;
  this->fed = vfed;
  memset(&this->allCallback,0,0x98);
  std::_Deque_base<helics::InputData,_std::allocator<helics::InputData>_>::_M_initialize_map
            ((_Deque_base<helics::InputData,_std::allocator<helics::InputData>_> *)&this->inputData,
             0);
  *(undefined8 *)((long)&(this->inputData).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->inputData).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->inputData).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->inputData).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  (this->inputData).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->inputData).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->inputData).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->inputData).enabled = bVar2;
  p_Var1 = &(this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->targetIDs).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->targetIDs).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->targetIDs).enabled = bVar2;
  p_Var1 = &(this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->inputTargets).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputTargets).m_mutex._M_impl._M_rwlock.__align = 0;
  (this->inputTargets).enabled = bVar2;
  return;
}

Assistant:

ValueFederateManager::ValueFederateManager(Core* coreOb,
                                           ValueFederate* vfed,
                                           LocalFederateId id,
                                           bool singleThreaded):
    fedID(id), inputs(!singleThreaded), publications(!singleThreaded), coreObject(coreOb),
    fed(vfed), inputData(!singleThreaded), targetIDs(!singleThreaded), inputTargets(!singleThreaded)
{
}